

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O0

string * BamTools::Internal::BamIndexFactory::FileExtension(string *filename)

{
  ulong uVar1;
  long lVar2;
  ulong in_RSI;
  string *in_RDI;
  size_t lastDotPosition;
  
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (uVar1 = std::__cxx11::string::length(), 4 < uVar1)) {
    lVar2 = std::__cxx11::string::find_last_of((char)in_RSI,0x2e);
    if (lVar2 == -1) {
      std::__cxx11::string::string((string *)in_RDI);
      return in_RDI;
    }
    std::__cxx11::string::substr((ulong)in_RDI,in_RSI);
    return in_RDI;
  }
  std::__cxx11::string::string((string *)in_RDI);
  return in_RDI;
}

Assistant:

const std::string BamIndexFactory::FileExtension(const std::string& filename)
{

    // if filename cannot contain valid path + extension, return empty string
    if (filename.empty() || filename.length() <= 4) {
        return std::string();
    }

    // look for last dot in filename
    const std::size_t lastDotPosition = filename.find_last_of('.');

    // if none found, return empty string
    if (lastDotPosition == std::string::npos) {
        return std::string();
    }

    // return substring from last dot position
    return filename.substr(lastDotPosition);
}